

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GetArrayOfStruct
          (PythonGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr,
          ImportMap *imports)

{
  Value *type;
  Parser *pPVar1;
  size_t t;
  string return_type;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
  *local_e0;
  Type *local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  Type local_b0;
  ImportMapEntry import_entry;
  string local_50;
  
  local_b0.base_type = (field->value).type.element;
  local_b0.fixed_length = (field->value).type.fixed_length;
  local_b0.element = BASE_TYPE_NONE;
  local_b0.struct_def = (field->value).type.struct_def;
  local_b0.enum_def = (field->value).type.enum_def;
  local_e0 = (_Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
              *)imports;
  GenReceiver(this,struct_def,code_ptr);
  (*(this->namer_).super_Namer._vptr_Namer[4])(&import_entry,&this->namer_,field);
  std::__cxx11::string::append((string *)code_ptr);
  type = &field->value;
  std::__cxx11::string::~string((string *)&import_entry);
  GenPackageReference_abi_cxx11_(&return_type,this,&type->type);
  local_d8 = &type->type;
  GenTypeGet_abi_cxx11_(&local_120,this,&type->type);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&import_entry,&return_type,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&return_type);
  if ((((this->super_BaseGenerator).parser_)->opts).python_typing == true) {
    ReturnType_abi_cxx11_(&return_type,this,struct_def,field);
    std::__cxx11::string::append((char *)code_ptr);
    std::operator+(&local_100," -> ",&return_type);
    std::operator+(&local_120,&local_100,":");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::
    _Rb_tree<std::pair<std::__cxx11::string,std::__cxx11::string>,std::pair<std::__cxx11::string,std::__cxx11::string>,std::_Identity<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::less<std::pair<std::__cxx11::string,std::__cxx11::string>>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
    ::_M_insert_unique<std::pair<std::__cxx11::string,std::__cxx11::string>const&>
              (local_e0,&import_entry);
    std::__cxx11::string::~string((string *)&return_type);
  }
  else {
    std::__cxx11::string::append((char *)code_ptr);
  }
  pPVar1 = (this->super_BaseGenerator).parser_;
  if (((pPVar1->opts).include_dependence_headers == true) && ((pPVar1->opts).python_typing == false)
     ) {
    GenIndents_abi_cxx11_(&return_type,this,2);
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&return_type);
    std::operator+(&local_d0,"from ",&import_entry.first);
    std::operator+(&local_100,&local_d0," import ");
    std::operator+(&local_120,&local_100,&import_entry.second);
    std::operator+(&return_type,&local_120,"\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&return_type);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_d0);
  }
  GenIndents_abi_cxx11_(&local_d0,this,2);
  std::operator+(&local_100,&local_d0,"obj = ");
  GenTypeGet_abi_cxx11_(&local_50,this,local_d8);
  std::operator+(&local_120,&local_100,&local_50);
  std::operator+(&return_type,&local_120,"()");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_d0);
  GenIndents_abi_cxx11_(&local_120,this,2);
  std::operator+(&return_type,&local_120,"obj.Init(self._tab.Bytes, self._tab.Pos + ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_120);
  NumToString<unsigned_short>(&local_120,(field->value).offset);
  std::operator+(&return_type,&local_120," + i * ");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_120);
  t = InlineSize(&local_b0);
  NumToString<unsigned_long>(&return_type,t);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&return_type);
  GenIndents_abi_cxx11_(&local_100,this,2);
  std::operator+(&local_120,")",&local_100);
  std::operator+(&return_type,&local_120,"return obj\n\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&return_type);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_100);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair(&import_entry);
  return;
}

Assistant:

void GetArrayOfStruct(const StructDef &struct_def, const FieldDef &field,
                        std::string *code_ptr, ImportMap &imports) const {
    auto &code = *code_ptr;
    const auto vec_type = field.value.type.VectorType();
    GenReceiver(struct_def, code_ptr);
    code += namer_.Method(field);

    const ImportMapEntry import_entry = {
      GenPackageReference(field.value.type), TypeName(field)
    };

    if (parser_.opts.python_typing) {
      const std::string return_type = ReturnType(struct_def, field);
      code += "(self, i: int)";
      code += " -> " + return_type + ":";

      imports.insert(import_entry);
    } else {
      code += "(self, i):";
    }

    if (parser_.opts.include_dependence_headers &&
        !parser_.opts.python_typing) {
      code += GenIndents(2);
      code += "from " + import_entry.first + " import " + import_entry.second +
              "\n";
    }

    code += GenIndents(2) + "obj = " + TypeName(field) + "()";
    code += GenIndents(2) + "obj.Init(self._tab.Bytes, self._tab.Pos + ";
    code += NumToString(field.value.offset) + " + i * ";
    code += NumToString(InlineSize(vec_type));
    code += ")" + GenIndents(2) + "return obj\n\n";
  }